

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerApp::OnDiagGetAnswerMessage
          (CommissionerApp *this,string *aPeerAddr,NetDiagData *aDiagAnsMsg)

{
  mapped_type *this_00;
  Address addr;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_40 [40];
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Address::Set((Error *)local_40,(Address *)&local_58,aPeerAddr);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  if (local_40._0_4_ == kNone) {
    this_00 = std::
              map<ot::commissioner::Address,_ot::commissioner::NetDiagData,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
              ::operator[](&this->mDiagAnsDataMap,(key_type *)&local_58);
    NetDiagData::operator=(this_00,aDiagAnsMsg);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
    return;
  }
  abort();
}

Assistant:

void CommissionerApp::OnDiagGetAnswerMessage(const std::string &aPeerAddr, const NetDiagData &aDiagAnsMsg)
{
    Address addr;

    SuccessOrDie(addr.Set(aPeerAddr));

    mDiagAnsDataMap[addr] = aDiagAnsMsg;
}